

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_max op;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  int local_174;
  undefined1 local_16d;
  int local_16c;
  float *local_168;
  undefined1 (*local_160) [32];
  undefined1 (*local_158) [32];
  undefined1 (*local_150) [32];
  undefined1 (*local_148) [32];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float *local_118;
  undefined1 (*local_110) [32];
  undefined1 (*local_108) [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  float *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined1 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  undefined1 (*local_b8) [32];
  undefined1 (*local_b0) [32];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_168 = in_RDX;
  local_160 = in_RSI;
  local_158 = in_RDI;
  for (local_174 = 0; local_174 + 7 < in_ECX; local_174 = local_174 + 8) {
    local_148 = local_158;
    local_1a0 = *(undefined8 *)*local_158;
    uStack_198 = *(undefined8 *)(*local_158 + 8);
    uStack_190 = *(undefined8 *)(*local_158 + 0x10);
    uStack_188 = *(undefined8 *)(*local_158 + 0x18);
    local_150 = local_160;
    local_1c0 = *(undefined8 *)*local_160;
    uStack_1b8 = *(undefined8 *)(*local_160 + 8);
    uStack_1b0 = *(undefined8 *)(*local_160 + 0x10);
    uStack_1a8 = *(undefined8 *)(*local_160 + 0x18);
    local_d8 = &local_16d;
    local_e0 = &local_1a0;
    local_e8 = &local_1c0;
    local_1e0 = vmaxps_avx(*local_158,*local_160);
    local_118 = local_168;
    local_140 = local_1e0._0_8_;
    uStack_138 = local_1e0._8_8_;
    uStack_130 = local_1e0._16_8_;
    uStack_128 = local_1e0._24_8_;
    *(undefined8 *)local_168 = local_1e0._0_8_;
    *(undefined8 *)(local_168 + 2) = local_1e0._8_8_;
    *(undefined8 *)(local_168 + 4) = local_1e0._16_8_;
    *(undefined8 *)(local_168 + 6) = local_1e0._24_8_;
    local_158 = local_158 + 1;
    local_160 = local_160 + 1;
    local_168 = local_168 + 8;
    local_a0 = local_1c0;
    uStack_98 = uStack_1b8;
    uStack_90 = uStack_1b0;
    uStack_88 = uStack_1a8;
    local_80 = local_1a0;
    uStack_78 = uStack_198;
    uStack_70 = uStack_190;
    uStack_68 = uStack_188;
  }
  for (; local_16c = in_ECX, local_174 + 3 < in_ECX; local_174 = local_174 + 4) {
    local_108 = local_158;
    local_1f0 = *(undefined8 *)*local_158;
    uStack_1e8 = *(undefined8 *)(*local_158 + 8);
    local_110 = local_160;
    local_200 = *(undefined8 *)*local_160;
    uStack_1f8 = *(undefined8 *)(*local_160 + 8);
    local_c0 = &local_16d;
    local_c8 = &local_1f0;
    local_d0 = &local_200;
    auVar1 = vmaxps_avx(*(undefined1 (*) [16])*local_158,*(undefined1 (*) [16])*local_160);
    local_f0 = local_168;
    local_210 = auVar1._0_8_;
    local_100 = local_210;
    uStack_208 = auVar1._8_8_;
    uStack_f8 = uStack_208;
    *(undefined8 *)local_168 = local_210;
    *(undefined8 *)(local_168 + 2) = uStack_208;
    local_158 = (undefined1 (*) [32])(*local_158 + 0x10);
    local_160 = (undefined1 (*) [32])(*local_160 + 0x10);
    local_168 = local_168 + 4;
    local_50 = local_200;
    uStack_48 = uStack_1f8;
    local_40 = local_1f0;
    uStack_38 = uStack_1e8;
  }
  for (; local_174 < local_16c; local_174 = local_174 + 1) {
    local_a8 = &local_16d;
    local_b0 = local_158;
    local_b8 = local_160;
    pfVar2 = std::max<float>((float *)local_158,(float *)local_160);
    *local_168 = *pfVar2;
    local_158 = (undefined1 (*) [32])(*local_158 + 4);
    local_160 = (undefined1 (*) [32])(*local_160 + 4);
    local_168 = local_168 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}